

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuronTest.cpp
# Opt level: O0

int main(void)

{
  double dVar1;
  Izhikevich_param *this;
  Izhikevich *this_00;
  Izhikevich *this_01;
  ostream *this_02;
  int i;
  Event *e;
  Izhikevich n;
  Izhikevich_param *p;
  Izhikevich_param *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  int n_neuronID;
  Izhikevich *in_stack_ffffffffffffff70;
  int local_88;
  double in_stack_ffffffffffffff80;
  Izhikevich local_70;
  Izhikevich_param *local_10;
  int local_4;
  
  n_neuronID = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  local_4 = 0;
  this = (Izhikevich_param *)operator_new(0x28);
  this->c = 0.0;
  this->d = 0.0;
  this->a = 0.0;
  this->b = 0.0;
  this->v_thres = 0.0;
  Izhikevich_param::Izhikevich_param(this);
  local_10 = this;
  Izhikevich::Izhikevich(in_stack_ffffffffffffff70,(long)this,n_neuronID,in_stack_ffffffffffffff58);
  this_00 = (Izhikevich *)operator_new(0x18);
  NoEvent::NoEvent((NoEvent *)this_00);
  this_01 = this_00;
  for (local_88 = 0; local_88 < 0x514; local_88 = local_88 + 1) {
    if (local_88 == 500) {
      this_01 = (Izhikevich *)operator_new(0x28);
      SpikeEvent::SpikeEvent((SpikeEvent *)this_00);
      *(int *)&(this_01->super_Neuron).logger = 1;
      this_01->u = 1.0;
    }
    else if (local_88 == 800) {
      this_01 = (Izhikevich *)operator_new(0x18);
      NoEvent::NoEvent((NoEvent *)this_00);
    }
    Izhikevich::handleEvent(&local_70,(Event *)this_01);
    Izhikevich::update(this_01,in_stack_ffffffffffffff80);
    dVar1 = Izhikevich::getMembranePotential(&local_70);
    this_02 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,dVar1);
    std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
    Izhikevich::resetInput(&local_70);
  }
  local_4 = 0;
  Izhikevich::~Izhikevich((Izhikevich *)0x1077a5);
  return local_4;
}

Assistant:

int main() 
{
    Izhikevich_param* p = new Izhikevich_param();
    Izhikevich n = Izhikevich(0, 0, p);
    Event* e = new NoEvent();

    for(int i = 0; i < 1300; i++) {
        if(i == 500) {
            e = new SpikeEvent();
            static_cast<SpikeEvent*>(e)->multiplicity = 1;
            static_cast<SpikeEvent*>(e)->weight = 1.0;
        }
        else if(i == 800) {
            e = new NoEvent();
        }

        n.handleEvent(e);
        n.update(0.3);
        cout << n.getMembranePotential() << endl;
        n.resetInput();
    }
    return 0;
}